

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

char * ImGui::GetNavInputName(ImGuiNavInput n)

{
  return _ZZN5ImGui15GetNavInputNameEiE5names_rel +
         *(int *)(_ZZN5ImGui15GetNavInputNameEiE5names_rel + (long)n * 4);
}

Assistant:

const char* ImGui::GetNavInputName(ImGuiNavInput n)
{
    static const char* names[] =
    {
        "Activate", "Cancel", "Input", "Menu", "DpadLeft", "DpadRight", "DpadUp", "DpadDown", "LStickLeft", "LStickRight", "LStickUp", "LStickDown",
        "FocusPrev", "FocusNext", "TweakSlow", "TweakFast", "KeyLeft", "KeyRight", "KeyUp", "KeyDown"
    };
    IM_ASSERT(IM_ARRAYSIZE(names) == ImGuiNavInput_COUNT);
    IM_ASSERT(n >= 0 && n < ImGuiNavInput_COUNT);
    return names[n];
}